

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall QtPrivate::QCalendarModel::setCalendar(QCalendarModel *this,undefined8 param_2)

{
  int iVar1;
  
  *(undefined8 *)&this->m_calendar = param_2;
  iVar1 = QDate::year(&this->m_date);
  this->m_shownYear = iVar1;
  iVar1 = QDate::month(&this->m_date,param_2);
  this->m_shownMonth = iVar1;
  internalUpdate(this);
  (**(code **)(*(long *)&(this->m_view->super_QTableView).super_QAbstractItemView.
                         super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x268))();
  return;
}

Assistant:

void QCalendarModel::setCalendar(QCalendar c)
{
    m_calendar = c;
    m_shownYear = m_date.year(c);
    m_shownMonth = m_date.month(c);
    internalUpdate();
    m_view->internalUpdate();
}